

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::JSONParser::ParseExpectedValues
          (JSONParser *this,
          vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_> *out_values)

{
  pointer *ppEVar1;
  pointer pEVar2;
  iterator __position;
  bool bVar3;
  Result RVar4;
  Enum EVar5;
  ExpectedValue value;
  ExpectedValue local_60;
  
  pEVar2 = (out_values->
           super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((out_values->
      super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>)._M_impl
      .super__Vector_impl_data._M_finish != pEVar2) {
    (out_values->
    super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>)._M_impl.
    super__Vector_impl_data._M_finish = pEVar2;
  }
  RVar4 = Expect(this,"[");
  EVar5 = Error;
  if (RVar4.enum_ != Error) {
    bVar3 = Match(this,"]");
    EVar5 = Ok;
    if (!bVar3) {
      do {
        RVar4 = ParseExpectedValue(this,&local_60,Yes);
        if (RVar4.enum_ == Error) break;
        __position._M_current =
             (out_values->
             super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out_values->
            super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spectest::ExpectedValue,std::allocator<spectest::ExpectedValue>>::
          _M_realloc_insert<spectest::ExpectedValue_const&>
                    ((vector<spectest::ExpectedValue,std::allocator<spectest::ExpectedValue>> *)
                     out_values,__position,&local_60);
        }
        else {
          *(undefined8 *)((__position._M_current)->nan + 1) = local_60.nan._4_8_;
          *(undefined8 *)((__position._M_current)->nan + 3) = local_60._40_8_;
          *(undefined8 *)((long)&((__position._M_current)->value).value + 8) =
               local_60.value.value._8_8_;
          (__position._M_current)->lane_type = (Type)local_60.lane_type.enum_;
          (__position._M_current)->nan[0] = local_60.nan[0];
          ((__position._M_current)->value).type = (ValueType)local_60.value.type.enum_;
          *(undefined4 *)&((__position._M_current)->value).field_0x4 = local_60.value._4_4_;
          ((__position._M_current)->value).value.i64_ = local_60.value.value.i64_;
          ppEVar1 = &(out_values->
                     super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppEVar1 = *ppEVar1 + 1;
        }
        bVar3 = Match(this,"]");
        if (bVar3) {
          return (Result)Ok;
        }
        RVar4 = Expect(this,",");
      } while (RVar4.enum_ != Error);
      EVar5 = Error;
    }
  }
  return (Result)EVar5;
}

Assistant:

wabt::Result JSONParser::ParseExpectedValues(
    std::vector<ExpectedValue>* out_values) {
  out_values->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    ExpectedValue value;
    CHECK_RESULT(ParseExpectedValue(&value, AllowExpected::Yes));
    out_values->push_back(value);
    first = false;
  }
  return wabt::Result::Ok;
}